

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProfileDef::~IfcProfileDef(IfcProfileDef *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcProfileDef_00821560;
  *(undefined ***)&this->field_0x58 = &PTR__IfcProfileDef_00821588;
  pcVar3 = (this->ProfileName).ptr._M_dataplus._M_p;
  paVar1 = &(this->ProfileName).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).field_0x10;
  puVar2 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).field_0x20;
  if (puVar4 != puVar2) {
    operator_delete(puVar4,*(long *)puVar2 + 1);
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

IfcProfileDef() : Object("IfcProfileDef") {}